

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O2

bool bssl::ssl_get_new_session(SSL_HANDSHAKE *hs)

{
  SSL *ssl;
  ssl_ctx_st *psVar1;
  CERT *pCVar2;
  UniquePtr<SSL_SESSION> __p_00;
  bool bVar3;
  uint16_t uVar4;
  int iVar5;
  uint32_t uVar6;
  __uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true> in_RAX;
  uint32_t uVar7;
  pointer __p;
  Span<const_unsigned_char> in;
  OPENSSL_timeval OVar8;
  UniquePtr<SSL_SESSION> session;
  
  ssl = hs->ssl;
  if ((ssl->mode & 0x200) == 0) {
    session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         in_RAX.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
    ssl_session_new((SSL_X509_METHOD *)
                    in_RAX.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
    if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
        session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
      bVar3 = false;
    }
    else {
      *(byte *)((long)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                      _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x1b8) =
           *(byte *)((long)session._M_t.
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x1b8) &
           0xef | (ssl->field_0xa4 & 1) << 4;
      *(uint16_t *)
       ((long)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 4) = ssl->s3->version;
      iVar5 = SSL_is_quic(ssl);
      *(byte *)((long)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                      _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x1b8) =
           *(byte *)((long)session._M_t.
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x1b8) &
           0xdf | (iVar5 != 0) << 5;
      OVar8 = ssl_ctx_get_current_time
                        ((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
      *(uint64_t *)
       ((long)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0xd0) = OVar8.tv_sec;
      uVar4 = ssl_protocol_version(ssl);
      psVar1 = (ssl->session_ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
      if (uVar4 < 0x304) {
        uVar6 = psVar1->session_timeout;
        uVar7 = uVar6;
      }
      else {
        uVar6 = psVar1->session_psk_dhe_timeout;
        uVar7 = 0x93a80;
      }
      *(uint32_t *)
       ((long)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 200) = uVar6;
      *(uint32_t *)
       ((long)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0xcc) = uVar7;
      pCVar2 = (hs->config->cert)._M_t.super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_bssl::CERT_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::CERT_*,_false>._M_head_impl;
      in.data_ = &pCVar2->sid_ctx;
      in.size_._0_1_ = (pCVar2->sid_ctx).size_;
      in.size_._1_7_ = 0;
      bVar3 = InplaceVector<unsigned_char,_32UL>::TryCopyFrom
                        ((InplaceVector<unsigned_char,_32UL> *)
                         ((long)session._M_t.
                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x6c),
                         in);
      __p_00 = session;
      if (bVar3) {
        *(byte *)((long)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x1b8) =
             *(byte *)((long)session._M_t.
                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x1b8) |
             4;
        *(undefined8 *)
         ((long)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0xc0) = 0x41;
        session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
        std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)&hs->new_session,
                   (pointer)__p_00._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
        bVar3 = true;
        ssl_set_session(ssl,(SSL_SESSION *)0x0);
      }
      else {
        bVar3 = false;
        ERR_put_error(0x10,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                      ,0xfc);
      }
    }
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&session);
  }
  else {
    bVar3 = false;
    ERR_put_error(0x10,0,0xd1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                  ,0xdd);
  }
  return bVar3;
}

Assistant:

bool ssl_get_new_session(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  if (ssl->mode & SSL_MODE_NO_SESSION_CREATION) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_SESSION_MAY_NOT_BE_CREATED);
    return false;
  }

  UniquePtr<SSL_SESSION> session = ssl_session_new(ssl->ctx->x509_method);
  if (session == NULL) {
    return false;
  }

  session->is_server = ssl->server;
  session->ssl_version = ssl->s3->version;
  session->is_quic = SSL_is_quic(ssl);

  // Fill in the time from the |SSL_CTX|'s clock.
  OPENSSL_timeval now = ssl_ctx_get_current_time(ssl->ctx.get());
  session->time = now.tv_sec;

  uint16_t version = ssl_protocol_version(ssl);
  if (version >= TLS1_3_VERSION) {
    // TLS 1.3 uses tickets as authenticators, so we are willing to use them for
    // longer.
    session->timeout = ssl->session_ctx->session_psk_dhe_timeout;
    session->auth_timeout = SSL_DEFAULT_SESSION_AUTH_TIMEOUT;
  } else {
    // TLS 1.2 resumption does not incorporate new key material, so we use a
    // much shorter timeout.
    session->timeout = ssl->session_ctx->session_timeout;
    session->auth_timeout = ssl->session_ctx->session_timeout;
  }

  if (!session->sid_ctx.TryCopyFrom(hs->config->cert->sid_ctx)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // The session is marked not resumable until it is completely filled in.
  session->not_resumable = true;
  session->verify_result = X509_V_ERR_INVALID_CALL;

  hs->new_session = std::move(session);
  ssl_set_session(ssl, NULL);
  return true;
}